

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_svucx(CPUTriCoreState *env)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t in_R8D;
  uint ptr;
  uintptr_t unaff_retaddr;
  
  uVar1 = env->FCX;
  if (uVar1 == 0) {
    raise_exception_sync_internal(env,3,4,unaff_retaddr,in_R8D);
  }
  ptr = (uVar1 & 0xffff) << 6 | (uVar1 & 0xf0000) << 0xc;
  uVar2 = cpu_ldl_data_tricore(env,ptr);
  save_context_upper(env,ptr);
  env->PCXI = ((env->ICR & 0x100) << 0xf | env->ICR << 0x18 | env->PCXI & 0x300000) +
              (env->FCX & 0xfffff) + 0x400000;
  env->FCX = uVar2 & 0xfffff | env->FCX & 0xfff00000;
  if (uVar1 != env->LCX) {
    return;
  }
  raise_exception_sync_internal(env,3,1,unaff_retaddr,in_R8D);
}

Assistant:

void helper_svucx(CPUTriCoreState *env)
{
    target_ulong tmp_FCX;
    target_ulong ea;
    target_ulong new_FCX;

    if (env->FCX == 0) {
        /* FCU trap */
        raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCU, GETPC());
    }
    /* tmp_FCX = FCX; */
    tmp_FCX = env->FCX;
    /* EA = {FCX.FCXS, 6'b0, FCX.FCXO, 6'b0}; */
    ea = ((env->FCX & MASK_FCX_FCXS) << 12) +
         ((env->FCX & MASK_FCX_FCXO) << 6);
    /* new_FCX = M(EA, word); */
    new_FCX = cpu_ldl_data(env, ea);
    /* M(EA, 16 * word) = {PCXI, PSW, A[10], A[11], D[8], D[9], D[10], D[11],
                           A[12], A[13], A[14], A[15], D[12], D[13], D[14],
                           D[15]}; */
    save_context_upper(env, ea);

    /* PCXI.PCPN = ICR.CCPN; */
    env->PCXI = (env->PCXI & 0xffffff) +
                ((env->ICR & MASK_ICR_CCPN) << 24);
    /* PCXI.PIE = ICR.IE; */
    env->PCXI = ((env->PCXI & ~MASK_PCXI_PIE_1_3) +
                ((env->ICR & MASK_ICR_IE_1_3) << 15));
    /* PCXI.UL = 1; */
    env->PCXI |= MASK_PCXI_UL;

    /* PCXI[19: 0] = FCX[19: 0]; */
    env->PCXI = (env->PCXI & 0xfff00000) + (env->FCX & 0xfffff);
    /* FCX[19: 0] = new_FCX[19: 0]; */
    env->FCX = (env->FCX & 0xfff00000) + (new_FCX & 0xfffff);

    /* if (tmp_FCX == LCX) trap(FCD);*/
    if (tmp_FCX == env->LCX) {
        /* FCD trap */
        raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCD, GETPC());
    }
}